

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

_Bool proc_terminated(pid_t pid,int *exit_status)

{
  uint in_EAX;
  __pid_t _Var1;
  int iVar2;
  int wstatus;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  _Var1 = waitpid(pid,(int *)((long)&uStack_18 + 4),1);
  if (-1 < _Var1) {
    if (_Var1 == pid) {
      if (((uStack_18 & 0x7f00000000) == 0) ||
         (0x1ffffff < (int)((uStack_18._4_4_ & 0x7f) * 0x1000000 + 0x1000000))) {
        iVar2 = wstatus_to_exit_status(pid,uStack_18._4_4_);
        *exit_status = iVar2;
        return true;
      }
      if (_Var1 != 0) goto LAB_00102954;
    }
    return false;
  }
  proc_terminated_cold_1();
LAB_00102954:
  __assert_fail("w == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                ,0x7d,"_Bool proc_terminated(pid_t, int *)");
}

Assistant:

bool proc_terminated(pid_t pid, int *exit_status) {
    int wstatus = 0;
    int w = waitpid(pid, &wstatus, WNOHANG);
    if (w < 0) {
        perror("waitpid");
        exit(EXIT_FAILURE);
    }

    if (w != pid) {
        return false;
    }

    if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus)) {
        *exit_status = wstatus_to_exit_status(pid, wstatus);
        return true;
    } else {
        assert(w == 0);
    }

    return false;
}